

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O1

uint glcts::PipelineStatisticsQueryUtilities::getNumberOfVerticesForPrimitiveType
               (_primitive_type primitive_type)

{
  TestError *this;
  
  if ((primitive_type < PRIMITIVE_TYPE_COUNT) && ((0x3dfU >> (primitive_type & 0x1f) & 1) != 0)) {
    return *(uint *)(&DAT_01ae8df8 + (ulong)primitive_type * 4);
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Unrecognized primitive type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
             ,0x338);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

unsigned int PipelineStatisticsQueryUtilities::getNumberOfVerticesForPrimitiveType(_primitive_type primitive_type)
{
	unsigned int result = 0;

	switch (primitive_type)
	{
	case PRIMITIVE_TYPE_POINTS:
		result = 1;
		break;
	case PRIMITIVE_TYPE_LINE_LOOP:  /* fall-through */
	case PRIMITIVE_TYPE_LINE_STRIP: /* fall-through */
	case PRIMITIVE_TYPE_LINES:
		result = 2;
		break;
	case PRIMITIVE_TYPE_TRIANGLE_FAN:   /* fall-through */
	case PRIMITIVE_TYPE_TRIANGLE_STRIP: /* fall-through */
	case PRIMITIVE_TYPE_TRIANGLES:
		result = 3;
		break;
	case PRIMITIVE_TYPE_LINES_ADJACENCY:
		result = 4;
		break;
	case PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
		result = 6;
		break;

	default:
		TCU_FAIL("Unrecognized primitive type");
	} /* switch (primitive_type) */

	return result;
}